

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

Node * __thiscall
QHashPrivate::Data<QCache<unsigned_long_long,_QOpenGLCachedTexture>::Node>::
findNode<unsigned_long_long>
          (Data<QCache<unsigned_long_long,_QOpenGLCachedTexture>::Node> *this,
          unsigned_long_long *key)

{
  byte bVar1;
  ulong uVar2;
  Node *pNVar3;
  Bucket BVar4;
  
  uVar2 = *key ^ this->seed;
  uVar2 = (uVar2 >> 0x20 ^ uVar2) * -0x2917014799a6026d;
  uVar2 = (uVar2 >> 0x20 ^ uVar2) * -0x2917014799a6026d;
  BVar4 = findBucketWithHash<unsigned_long_long>(this,key,uVar2 >> 0x20 ^ uVar2);
  bVar1 = (BVar4.span)->offsets[BVar4.index];
  if (bVar1 == 0xff) {
    pNVar3 = (Node *)0x0;
  }
  else {
    pNVar3 = (Node *)(((BVar4.span)->entries->storage).data + (uint)bVar1 * 0x28);
  }
  return pNVar3;
}

Assistant:

Node *findNode(const K &key) const noexcept
    {
        auto bucket = findBucket(key);
        if (bucket.isUnused())
            return nullptr;
        return bucket.node();
    }